

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsKeyPressed(ImGuiKey key,bool repeat)

{
  float repeat_delay;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiKeyData *pIVar4;
  
  pIVar1 = GImGui;
  pIVar4 = GetKeyData(key);
  bVar2 = pIVar4->DownDuration == 0.0;
  if (repeat && !bVar2) {
    repeat_delay = (pIVar1->IO).KeyRepeatDelay;
    if (pIVar4->DownDuration <= repeat_delay) {
      bVar2 = false;
    }
    else {
      iVar3 = GetKeyPressedAmount(key,repeat_delay,(pIVar1->IO).KeyRepeatRate);
      bVar2 = 0 < iVar3;
    }
  }
  return bVar2;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, bool repeat)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(key, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}